

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

_Bool deserialization_test(char *data,size_t size)

{
  _Bool _Var1;
  roaring_bitmap_t *r;
  uint64_t uVar2;
  uint64_t uVar3;
  uint32_t i;
  uint32_t val;
  char *reason_failure;
  char *local_28;
  
  r = roaring_bitmap_portable_deserialize_safe(data,size);
  if (r != (roaring_bitmap_t *)0x0) {
    local_28 = (char *)0x0;
    _Var1 = roaring_bitmap_internal_validate(r,&local_28);
    if (_Var1) {
      uVar2 = roaring_bitmap_get_cardinality(r);
      val = 100;
      do {
        _Var1 = roaring_bitmap_contains(r,val);
        if (!_Var1) {
          uVar2 = (uint64_t)((int)uVar2 + 1);
          roaring_bitmap_add(r,val);
        }
        val = val + 1;
      } while (val != 1000);
      uVar3 = roaring_bitmap_get_cardinality(r);
      if ((int)uVar2 != (int)uVar3) {
        return false;
      }
    }
    roaring_bitmap_free(r);
  }
  return true;
}

Assistant:

bool deserialization_test(const char *data, size_t size) {
    // We test that deserialization never fails.
    roaring_bitmap_t *bitmap =
        roaring_bitmap_portable_deserialize_safe(data, size);
    if (bitmap) {
        // The bitmap may not be usable if it does not follow the specification.
        // We can validate the bitmap we recovered to make sure it is proper.
        const char *reason_failure = NULL;
        if (roaring_bitmap_internal_validate(bitmap, &reason_failure)) {
            // the bitmap is ok!
            uint32_t cardinality = roaring_bitmap_get_cardinality(bitmap);

            for (uint32_t i = 100; i < 1000; i++) {
                if (!roaring_bitmap_contains(bitmap, i)) {
                    cardinality++;
                    roaring_bitmap_add(bitmap, i);
                }
            }

            uint32_t new_cardinality = roaring_bitmap_get_cardinality(bitmap);
            if (cardinality != new_cardinality) {
                return false;
            }
        }
        roaring_bitmap_free(bitmap);
    }
    return true;
}